

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench_ecmult.c
# Opt level: O0

void bench_ecmult_multi_teardown(void *arg,int iters)

{
  ulong uVar1;
  int iVar2;
  int in_ESI;
  long in_RDI;
  secp256k1_gej tmp;
  int iter;
  bench_data *data;
  secp256k1_fe *in_stack_00000108;
  secp256k1_gej *in_stack_00000110;
  secp256k1_gej *in_stack_00000118;
  secp256k1_gej *in_stack_00000120;
  int local_1c;
  
  uVar1 = *(ulong *)(in_RDI + 0x40);
  local_1c = 0;
  while( true ) {
    if ((int)((ulong)(long)in_ESI / uVar1) <= local_1c) {
      return;
    }
    secp256k1_gej_add_var(in_stack_00000120,in_stack_00000118,in_stack_00000110,in_stack_00000108);
    iVar2 = secp256k1_gej_is_infinity((secp256k1_gej *)0x121c20);
    if (iVar2 == 0) break;
    local_1c = local_1c + 1;
  }
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/bench_ecmult.c"
          ,0xe2,"test condition failed: secp256k1_gej_is_infinity(&tmp)");
  abort();
}

Assistant:

static void bench_ecmult_multi_teardown(void* arg, int iters) {
    bench_data* data = (bench_data*)arg;
    int iter;
    iters = iters / data->count;
    /* Verify the results in teardown, to avoid doing comparisons while benchmarking. */
    for (iter = 0; iter < iters; ++iter) {
        secp256k1_gej tmp;
        secp256k1_gej_add_var(&tmp, &data->output[iter], &data->expected_output[iter], NULL);
        CHECK(secp256k1_gej_is_infinity(&tmp));
    }
}